

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

int kvtree_unset_all(kvtree *hash)

{
  kvtree_elem *pkVar1;
  kvtree_elem *tmp;
  kvtree_elem *elem;
  kvtree *hash_local;
  
  tmp = kvtree_elem_first(hash);
  while (tmp != (kvtree_elem *)0x0) {
    pkVar1 = kvtree_elem_next(tmp);
    kvtree_elem_extract_by_addr(hash,tmp);
    kvtree_elem_delete(tmp);
    tmp = pkVar1;
  }
  return 0;
}

Assistant:

int kvtree_unset_all(kvtree* hash)
{
  kvtree_elem* elem = kvtree_elem_first(hash);
  while (elem != NULL) {
    /* remember this element */
    kvtree_elem* tmp = elem;

    /* get the next element */
    elem = kvtree_elem_next(elem);

    /* extract and delete the current element by address */
    kvtree_elem_extract_by_addr(hash, tmp);
    kvtree_elem_delete(tmp);
  }
  return KVTREE_SUCCESS;
}